

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void write_vram(Emulator *e,MaskedAddress addr,u8 value)

{
  undefined6 in_register_00000032;
  char *func_name;
  
  func_name = (char *)CONCAT62(in_register_00000032,addr);
  ppu_synchronize(e);
  if ((e->state).ppu.stat.mode == PPU_MODE_MODE3) {
    HOOK_write_vram_in_use_ab(e,func_name,addr,(ulong)value);
    return;
  }
  if (addr < 0x2000) {
    (e->state).vram.data[(ulong)(e->state).vram.offset + (ulong)addr] = value;
    return;
  }
  __assert_fail("addr <= ADDR_MASK_8K",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                0x7df,"void write_vram(Emulator *, MaskedAddress, u8)");
}

Assistant:

static void write_vram(Emulator* e, MaskedAddress addr, u8 value) {
  ppu_synchronize(e);
  if (UNLIKELY(is_using_vram(e, TRUE))) {
    HOOK(write_vram_in_use_ab, addr, value);
    return;
  }

  assert(addr <= ADDR_MASK_8K);
  VRAM.data[VRAM.offset + addr] = value;
}